

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O3

ScriptSet * __thiscall icu_63::ScriptSet::set(ScriptSet *this,UScriptCode script,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return this;
  }
  if (0xbf < (uint)script) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return this;
  }
  this->bits[(uint)script >> 5] = this->bits[(uint)script >> 5] | 1 << ((byte)script & 0x1f);
  return this;
}

Assistant:

ScriptSet &ScriptSet::set(UScriptCode script, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (script < 0 || script >= (int32_t)sizeof(bits) * 8) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    uint32_t index = script / 32;
    uint32_t bit   = 1 << (script & 31);
    bits[index] |= bit;
    return *this;
}